

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

string * __thiscall
wabt::anon_unknown_0::CWriter::FindUniqueName
          (string *__return_storage_ptr__,CWriter *this,SymbolSet *set,string_view proposed_name)

{
  long *plVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  iterator iVar5;
  long *plVar6;
  _Base_ptr extraout_RAX;
  size_t sVar7;
  ulong uVar8;
  char cVar9;
  ulong __val;
  string __str_1;
  string base;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  uint local_68;
  long local_60 [2];
  _Base_ptr local_50 [2];
  long local_40;
  
  sVar7 = proposed_name._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,sVar7,&(set->_M_t)._M_impl.field_0x0 + sVar7,sVar7,
             proposed_name._M_str);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this,__return_storage_ptr__);
  if (iVar5._M_node != (_Base_ptr)&this->module_) {
    local_50[0] = (_Base_ptr)&local_40;
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
    std::__cxx11::string::append((char *)local_50);
    __val = 0;
    do {
      cVar9 = '\x01';
      if (9 < __val) {
        uVar8 = __val;
        cVar4 = '\x04';
        do {
          cVar9 = cVar4;
          if (uVar8 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_001a082b;
          }
          if (uVar8 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_001a082b;
          }
          if (uVar8 < 10000) goto LAB_001a082b;
          bVar3 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
          cVar4 = cVar9 + '\x04';
        } while (bVar3);
        cVar9 = cVar9 + '\x01';
      }
LAB_001a082b:
      local_70 = local_60;
      std::__cxx11::string::_M_construct((ulong)&local_70,cVar9);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,__val);
      plVar6 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_70,0,(char *)0x0,(ulong)local_50[0]);
      plVar1 = plVar6 + 2;
      if ((long *)*plVar6 == plVar1) {
        local_80 = *plVar1;
        lStack_78 = plVar6[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar1;
        local_90 = (long *)*plVar6;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)plVar1;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      __val = __val + 1;
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this,__return_storage_ptr__);
    } while (iVar5._M_node != (_Base_ptr)&this->module_);
    iVar5._M_node = (_Base_ptr)&local_40;
    if (local_50[0] != iVar5._M_node) {
      operator_delete(local_50[0],local_40 + 1);
      iVar5._M_node = extraout_RAX;
    }
  }
  return (string *)iVar5._M_node;
}

Assistant:

std::string CWriter::FindUniqueName(SymbolSet& set,
                                    std::string_view proposed_name) const {
  std::string unique{proposed_name};
  if (set.find(unique) != set.end()) {
    std::string base = unique + "_";
    size_t count = 0;
    do {
      unique = base + std::to_string(count++);
    } while (set.find(unique) != set.end());
  }
  return unique;
}